

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O2

Msgs * __thiscall curlpp::Multi::info_abi_cxx11_(Msgs *__return_storage_ptr__,Multi *this)

{
  CURLMSG CVar1;
  CURLMSG CVar2;
  CURLMSG *pCVar3;
  mapped_type *ppEVar4;
  int msgsInQueue;
  undefined1 local_44 [4];
  value_type local_40;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
  )._M_impl._M_node._M_size = 0;
  while( true ) {
    pCVar3 = (CURLMSG *)curl_multi_info_read(this->mMultiHandle,local_44);
    if (pCVar3 == (CURLMSG *)0x0) break;
    CVar1 = *pCVar3;
    CVar2 = pCVar3[4];
    ppEVar4 = std::
              map<void_*,_const_curlpp::Easy_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_const_curlpp::Easy_*>_>_>
              ::operator[](&this->mHandles,(key_type *)(pCVar3 + 2));
    local_40.first = *ppEVar4;
    local_40.second.msg = CVar1;
    local_40.second.code = CVar2;
    std::__cxx11::
    list<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>,_std::allocator<std::pair<const_curlpp::Easy_*,_curlpp::Multi::Info>_>_>
    ::push_back(__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

curlpp::Multi::Msgs
curlpp::Multi::info()
{
  CURLMsg * msg; /* for picking up messages with the transfer status */
  
  int msgsInQueue;
  Msgs result;
  while ((msg = curl_multi_info_read(mMultiHandle, &msgsInQueue)) != NULL) {
    Multi::Info inf;
    inf.msg = msg->msg;
    inf.code = msg->data.result;
    result.push_back(std::make_pair(mHandles[msg->easy_handle],inf));
  }

  return result;
}